

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void __thiscall cmSystemToolsArgV::~cmSystemToolsArgV(cmSystemToolsArgV *this)

{
  char **ppcVar1;
  
  for (ppcVar1 = this->ArgV; (ppcVar1 != (char **)0x0 && (*ppcVar1 != (char *)0x0));
      ppcVar1 = ppcVar1 + 1) {
    free(*ppcVar1);
  }
  free(this->ArgV);
  return;
}

Assistant:

~cmSystemToolsArgV()
    {
    for(char** arg = this->ArgV; arg && *arg; ++arg)
      {
      free(*arg);
      }
    free(this->ArgV);
    }